

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrGetSpaceUserIdFB(XrSpaceUserFB user,XrSpaceUserIdFB *userId)

{
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar1;
  ValidateXrHandleResult VVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_329;
  string local_328 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_308;
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  GenValidUsageXrInstanceInfo *local_2a0;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_spaceuserfb_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_278 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  XrSpaceUserFB_T local_1f0 [32];
  ostringstream local_1d0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_44;
  undefined1 local_40 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrSpaceUserIdFB *userId_local;
  XrSpaceUserFB user_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  userId_local = (XrSpaceUserIdFB *)user;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  local_44 = XR_OBJECT_TYPE_SPACE_USER_FB;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSpaceUserFB_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_40
             ,(XrSpaceUserFB_T **)&userId_local,&local_44);
  VVar2 = VerifyXrSpaceUserFBHandle((XrSpaceUserFB *)&userId_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSpaceUserFB_T_*>::getWithInstanceInfo
                      (&g_spaceuserfb_info,(XrSpaceUserFB_T *)userId_local);
    pVar3.second = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    if (userId == (XrSpaceUserIdFB *)0x0) {
      local_2a0 = pVar3.second;
      gen_spaceuserfb_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
      info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar3.second;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,"VUID-xrGetSpaceUserIdFB-userId-parameter",&local_2c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"xrGetSpaceUserIdFB",&local_2e9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_308,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_328,
                 "Invalid NULL for XrSpaceUserIdFB \"userId\" which is not optional and must be non-NULL"
                 ,&local_329);
      CoreValidLogMessage(pVar3.second,(string *)local_2c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2e8,&local_308,(string *)local_328);
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_308);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
      pVar1.first = gen_spaceuserfb_info;
      pVar3.second = local_2a0;
      pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
      user_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else {
      user_local._4_4_ =
           objects_info.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      info_with_instance.second._4_4_ = 1;
      pVar1 = pVar3;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d0);
    std::operator<<((ostream *)local_1d0,"Invalid XrSpaceUserFB handle \"user\" ");
    HandleToHexString<XrSpaceUserFB_T*>(local_1f0);
    std::operator<<((ostream *)local_1d0,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,"VUID-xrGetSpaceUserIdFB-user-parameter",&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"xrGetSpaceUserIdFB",&local_239);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_258,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_40);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_210,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_238,&local_258,local_278);
    std::__cxx11::string::~string((string *)local_278);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_258);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    user_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d0);
    pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
    pVar1.first = gen_spaceuserfb_info;
    pVar3.second = local_2a0;
    pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
  }
  info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar1.second;
  gen_spaceuserfb_info = pVar1.first;
  local_2a0 = pVar3.second;
  gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  return user_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrGetSpaceUserIdFB(
XrSpaceUserFB user,
XrSpaceUserIdFB* userId) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(user, XR_OBJECT_TYPE_SPACE_USER_FB);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSpaceUserFBHandle(&user);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSpaceUserFB handle \"user\" ";
                oss << HandleToHexString(user);
                CoreValidLogMessage(nullptr, "VUID-xrGetSpaceUserIdFB-user-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSpaceUserIdFB",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_spaceuserfb_info.getWithInstanceInfo(user);
        GenValidUsageXrHandleInfo *gen_spaceuserfb_info = info_with_instance.first;
        (void)gen_spaceuserfb_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == userId) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSpaceUserIdFB-userId-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSpaceUserIdFB", objects_info,
                                "Invalid NULL for XrSpaceUserIdFB \"userId\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrGetSpaceUserIdFB-userId-parameter" type
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}